

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_verify(secp256k1_scalar *r)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined8 uVar63;
  uint uVar64;
  undefined4 extraout_EAX;
  int iVar65;
  ulong uVar66;
  ulong uVar67;
  secp256k1_gej *psVar68;
  int64_t iVar69;
  int64_t iVar70;
  secp256k1_modinv64_signed62 *psVar71;
  byte bVar72;
  undefined4 uVar73;
  int iVar74;
  uint uVar75;
  secp256k1_gej *psVar76;
  secp256k1_gej *psVar77;
  secp256k1_scalar *r_00;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong *extraout_RDX;
  long lVar83;
  long lVar84;
  long lVar85;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_00;
  secp256k1_modinv64_signed62 *b;
  secp256k1_gej *psVar86;
  secp256k1_gej *psVar87;
  long lVar88;
  ulong uVar89;
  uint uVar90;
  secp256k1_modinv64_signed62 *psVar91;
  secp256k1_gej *psVar92;
  secp256k1_gej *psVar93;
  secp256k1_gej *psVar94;
  secp256k1_modinv64_signed62 *psVar95;
  secp256k1_fe *a_00;
  secp256k1_gej *a_01;
  secp256k1_gej *psVar96;
  secp256k1_modinv64_signed62 *a_02;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  secp256k1_gej *psVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  secp256k1_gej *psVar110;
  uint64_t *puVar111;
  long lVar112;
  undefined1 *puVar113;
  secp256k1_gej *psVar114;
  long lVar115;
  ulong uVar116;
  secp256k1_gej *psVar117;
  long lVar118;
  ulong uVar119;
  ulong uVar120;
  long lVar121;
  secp256k1_gej *psVar122;
  bool bVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  secp256k1_modinv64_signed62 sStack_480;
  secp256k1_modinv64_signed62 sStack_458;
  secp256k1_gej *psStack_430;
  secp256k1_gej *psStack_428;
  secp256k1_gej *psStack_420;
  ulong uStack_418;
  secp256k1_gej *psStack_410;
  ulong uStack_408;
  secp256k1_gej *psStack_400;
  secp256k1_gej *psStack_3f8;
  long lStack_3f0;
  secp256k1_gej *psStack_3e8;
  secp256k1_gej *psStack_3e0;
  secp256k1_gej *psStack_3d8;
  uint64_t uStack_3d0;
  secp256k1_gej *psStack_3c8;
  secp256k1_gej *psStack_3c0;
  secp256k1_gej *psStack_3b8;
  secp256k1_gej *psStack_3b0;
  uint64_t uStack_3a8;
  secp256k1_gej *psStack_3a0;
  secp256k1_gej *psStack_398;
  secp256k1_gej *psStack_390;
  secp256k1_gej *psStack_388;
  secp256k1_gej *psStack_380;
  secp256k1_gej *psStack_378;
  long lStack_370;
  secp256k1_gej *psStack_368;
  code *pcStack_360;
  uint uStack_354;
  secp256k1_gej *psStack_350;
  secp256k1_gej *apsStack_348 [2];
  undefined1 auStack_338 [56];
  uint64_t uStack_300;
  uint64_t uStack_2f8;
  uint64_t uStack_2f0;
  uint64_t uStack_2e8;
  secp256k1_modinv64_trans2x2 sStack_2d8;
  undefined1 auStack_2b8 [96];
  ulong uStack_258;
  ulong uStack_250;
  secp256k1_gej *psStack_248;
  ulong uStack_240;
  secp256k1_gej *psStack_238;
  secp256k1_gej *psStack_228;
  secp256k1_gej *psStack_220;
  secp256k1_gej *psStack_210;
  secp256k1_fe *psStack_208;
  secp256k1_fe sStack_200;
  ulong uStack_1d0;
  ulong uStack_1c8;
  code *pcStack_1c0;
  ulong uStack_1b0;
  ulong uStack_1a8;
  ulong uStack_1a0;
  ulong uStack_198;
  ulong uStack_190;
  ulong uStack_188;
  ulong uStack_180;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  ulong uStack_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong uStack_140;
  ulong uStack_138;
  ulong uStack_130;
  ulong uStack_128;
  ulong uStack_120;
  ulong uStack_118;
  ulong uStack_110;
  ulong uStack_108;
  ulong uStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  undefined1 auStack_b8 [16];
  secp256k1_gej *psStack_a0;
  ulong uStack_98;
  ulong uStack_90;
  secp256k1_modinv64_signed62 *psStack_88;
  ulong uStack_80;
  code *pcStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  secp256k1_modinv64_signed62 sStack_60;
  secp256k1_scalar *r_01;
  
  bVar123 = r->d[3] == 0xffffffffffffffff;
  uVar75 = (uint)((0xfffffffffffffffd < r->d[2] && bVar123) && 0xbaaedce6af48a03a < r->d[1]);
  uVar90 = 0;
  if (0xbaaedce6af48a03b < r->d[1]) {
    uVar90 = uVar75;
  }
  uVar90 = uVar90 | (r->d[2] == 0xffffffffffffffff && bVar123);
  r_01 = (secp256k1_scalar *)(ulong)uVar90;
  uVar64 = 0;
  if (0xbfd25e8cd0364140 < r->d[0]) {
    uVar64 = uVar75;
  }
  if (uVar64 == 0 && uVar90 == 0) {
    return;
  }
  secp256k1_scalar_verify_cold_1();
  pcStack_78 = (code *)0x142137;
  secp256k1_scalar_verify(r_01);
  uStack_70 = r_01->d[2] | r_01->d[0];
  uStack_68 = r_01->d[3] | r_01->d[1];
  pcStack_78 = (code *)0x14214f;
  secp256k1_scalar_verify(r_01);
  uVar116 = r_01->d[0];
  uVar119 = r_01->d[1];
  uVar67 = r_01->d[2];
  uVar89 = r_01->d[3];
  pcStack_78 = (code *)0x142166;
  secp256k1_scalar_verify(r_01);
  uVar73 = 0xffffffff;
  uVar120 = uVar116 & 0x3fffffffffffffff;
  uVar116 = (uVar119 & 0xfffffffffffffff) << 2 | uVar116 >> 0x3e;
  uVar119 = (uVar67 & 0x3ffffffffffffff) << 4 | uVar119 >> 0x3c;
  sStack_60.v[3] = (uVar89 & 0xffffffffffffff) << 6 | uVar67 >> 0x3a;
  uVar89 = uVar89 >> 0x38;
  pcStack_78 = (code *)0x1421b9;
  sStack_60.v[0] = uVar120;
  sStack_60.v[1] = uVar116;
  sStack_60.v[2] = uVar119;
  sStack_60.v[4] = uVar89;
  secp256k1_modinv64_var(&sStack_60,&secp256k1_const_modinfo_scalar);
  pcStack_78 = (code *)0x1421c4;
  psVar91 = &sStack_60;
  secp256k1_scalar_from_signed62(r,&sStack_60);
  pcStack_78 = (code *)0x1421cc;
  secp256k1_scalar_verify(r);
  pcStack_78 = (code *)0x1421d4;
  psVar122 = (secp256k1_gej *)r;
  secp256k1_scalar_verify(r);
  auVar124._0_4_ =
       -(uint)((int)(((secp256k1_gej *)r)->x).n[2] == 0 && (int)(((secp256k1_gej *)r)->x).n[0] == 0)
  ;
  auVar124._4_4_ =
       -(uint)(*(int *)((long)(((secp256k1_gej *)r)->x).n + 0x14) == 0 &&
              *(int *)((long)(((secp256k1_gej *)r)->x).n + 4) == 0);
  auVar124._8_4_ =
       -(uint)((int)(((secp256k1_gej *)r)->x).n[3] == 0 && (int)(((secp256k1_gej *)r)->x).n[1] == 0)
  ;
  auVar124._12_4_ =
       -(uint)(*(int *)((long)(((secp256k1_gej *)r)->x).n + 0x1c) == 0 &&
              *(int *)((long)(((secp256k1_gej *)r)->x).n + 0xc) == 0);
  iVar65 = movmskps(extraout_EAX,auVar124);
  auVar125._0_4_ = -(uint)((int)uStack_70 == 0);
  auVar125._4_4_ = -(uint)(uStack_70._4_4_ == 0);
  auVar125._8_4_ = -(uint)((int)uStack_68 == 0);
  auVar125._12_4_ = -(uint)(uStack_68._4_4_ == 0);
  iVar74 = movmskps(uVar73,auVar125);
  if ((iVar74 != 0xf) != (iVar65 == 0xf)) {
    return;
  }
  pcStack_78 = secp256k1_scalar_mul;
  secp256k1_scalar_inverse_var_cold_1();
  pcStack_1c0 = (code *)0x14223e;
  psStack_a0 = (secp256k1_gej *)r;
  uStack_98 = uVar116;
  uStack_90 = uVar119;
  psStack_88 = &sStack_60;
  uStack_80 = uVar120;
  pcStack_78 = (code *)uVar89;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar91);
  pcStack_1c0 = (code *)0x142246;
  secp256k1_scalar_verify(r_00);
  uVar116 = psVar91->v[0];
  uVar119 = psVar91->v[1];
  uVar67 = psVar91->v[2];
  uVar89 = r_00->d[0];
  uVar120 = r_00->d[1];
  uVar109 = r_00->d[2];
  uVar104 = r_00->d[3];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar116;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar89;
  uVar78 = SUB168(auVar5 * auVar21,8);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar78;
  uStack_e8 = SUB168(auVar5 * auVar21,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar116;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar120;
  auVar6 = auVar6 * auVar22;
  uVar97 = SUB168(auVar6 + auVar60,0);
  uVar102 = SUB168(auVar6 + auVar60,8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar119;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar89;
  uVar79 = SUB168(auVar7 * auVar23,8);
  uVar66 = SUB168(auVar7 * auVar23,0);
  uStack_e0 = uVar97 + uVar66;
  uVar66 = (ulong)CARRY8(uVar97,uVar66);
  uVar97 = uVar102 + uVar79;
  uVar103 = uVar97 + uVar66;
  uVar105 = (ulong)CARRY8(auVar6._8_8_,(ulong)CARRY8(uVar78,auVar6._0_8_)) +
            (ulong)(CARRY8(uVar102,uVar79) || CARRY8(uVar97,uVar66));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar116;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar109;
  uVar80 = SUB168(auVar8 * auVar24,8);
  uVar66 = SUB168(auVar8 * auVar24,0);
  uVar78 = uVar103 + uVar66;
  uVar66 = (ulong)CARRY8(uVar103,uVar66);
  uVar79 = uVar105 + uVar80;
  uVar106 = uVar79 + uVar66;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar119;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar120;
  uVar81 = SUB168(auVar9 * auVar25,8);
  uVar97 = SUB168(auVar9 * auVar25,0);
  uVar103 = uVar78 + uVar97;
  uVar97 = (ulong)CARRY8(uVar78,uVar97);
  uVar102 = uVar106 + uVar81;
  uVar107 = uVar102 + uVar97;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar67;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar89;
  uVar82 = SUB168(auVar10 * auVar26,8);
  uVar78 = SUB168(auVar10 * auVar26,0);
  uStack_d8 = uVar103 + uVar78;
  uVar78 = (ulong)CARRY8(uVar103,uVar78);
  uVar103 = uVar107 + uVar82;
  uVar108 = uVar103 + uVar78;
  uVar107 = (ulong)(CARRY8(uVar105,uVar80) || CARRY8(uVar79,uVar66)) +
            (ulong)(CARRY8(uVar106,uVar81) || CARRY8(uVar102,uVar97)) +
            (ulong)(CARRY8(uVar107,uVar82) || CARRY8(uVar103,uVar78));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar116;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar104;
  uVar81 = SUB168(auVar11 * auVar27,8);
  uVar116 = SUB168(auVar11 * auVar27,0);
  uVar78 = uVar108 + uVar116;
  uVar66 = (ulong)CARRY8(uVar108,uVar116);
  uVar79 = uVar107 + uVar81;
  uVar108 = uVar79 + uVar66;
  uVar116 = psVar91->v[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar119;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar109;
  uVar82 = SUB168(auVar12 * auVar28,8);
  uVar97 = SUB168(auVar12 * auVar28,0);
  uVar103 = uVar78 + uVar97;
  uVar97 = (ulong)CARRY8(uVar78,uVar97);
  uVar102 = uVar108 + uVar82;
  uVar98 = uVar102 + uVar97;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar67;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar120;
  uVar105 = SUB168(auVar13 * auVar29,8);
  uVar78 = SUB168(auVar13 * auVar29,0);
  uVar80 = uVar103 + uVar78;
  uVar78 = (ulong)CARRY8(uVar103,uVar78);
  uVar103 = uVar98 + uVar105;
  uVar99 = uVar103 + uVar78;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar116;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar89;
  uVar106 = SUB168(auVar14 * auVar30,8);
  uVar89 = SUB168(auVar14 * auVar30,0);
  uStack_d0 = uVar80 + uVar89;
  uVar89 = (ulong)CARRY8(uVar80,uVar89);
  uVar80 = uVar99 + uVar106;
  uVar100 = uVar80 + uVar89;
  uVar81 = (ulong)(CARRY8(uVar107,uVar81) || CARRY8(uVar79,uVar66)) +
           (ulong)(CARRY8(uVar108,uVar82) || CARRY8(uVar102,uVar97)) +
           (ulong)(CARRY8(uVar98,uVar105) || CARRY8(uVar103,uVar78)) +
           (ulong)(CARRY8(uVar99,uVar106) || CARRY8(uVar80,uVar89));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar119;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar104;
  uVar102 = SUB168(auVar15 * auVar31,8);
  uVar89 = SUB168(auVar15 * auVar31,0);
  uVar78 = uVar100 + uVar89;
  uVar89 = (ulong)CARRY8(uVar100,uVar89);
  uVar97 = uVar81 + uVar102;
  uVar82 = uVar97 + uVar89;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar67;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar109;
  uVar103 = SUB168(auVar16 * auVar32,8);
  uVar66 = SUB168(auVar16 * auVar32,0);
  uVar79 = uVar78 + uVar66;
  uVar66 = (ulong)CARRY8(uVar78,uVar66);
  uVar78 = uVar82 + uVar103;
  uVar105 = uVar78 + uVar66;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar116;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar120;
  uVar80 = SUB168(auVar17 * auVar33,8);
  uVar120 = SUB168(auVar17 * auVar33,0);
  uStack_c8 = uVar79 + uVar120;
  uVar120 = (ulong)CARRY8(uVar79,uVar120);
  uVar79 = uVar105 + uVar80;
  uVar106 = uVar79 + uVar120;
  uVar79 = (ulong)(CARRY8(uVar81,uVar102) || CARRY8(uVar97,uVar89)) +
           (ulong)(CARRY8(uVar82,uVar103) || CARRY8(uVar78,uVar66)) +
           (ulong)(CARRY8(uVar105,uVar80) || CARRY8(uVar79,uVar120));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar67;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar104;
  uVar66 = SUB168(auVar18 * auVar34,8);
  uVar67 = SUB168(auVar18 * auVar34,0);
  uVar78 = uVar106 + uVar67;
  uVar67 = (ulong)CARRY8(uVar106,uVar67);
  uVar120 = uVar79 + uVar66;
  uVar102 = uVar120 + uVar67;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar116;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar109;
  uVar97 = SUB168(auVar19 * auVar35,8);
  uVar89 = SUB168(auVar19 * auVar35,0);
  uStack_c0 = uVar78 + uVar89;
  uVar89 = (ulong)CARRY8(uVar78,uVar89);
  uVar109 = uVar102 + uVar97;
  auVar53._8_8_ =
       (ulong)(CARRY8(uVar79,uVar66) || CARRY8(uVar120,uVar67)) +
       (ulong)(CARRY8(uVar102,uVar97) || CARRY8(uVar109,uVar89));
  auVar53._0_8_ = uVar109 + uVar89;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar116;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar104;
  auStack_b8 = auVar20 * auVar36 + auVar53;
  uVar63 = auStack_b8._8_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uStack_e8;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uStack_c8;
  auVar54 = ZEXT816(0x402da1732fc9bebf) * auVar37 + auVar54;
  uStack_158 = auVar54._0_8_;
  uVar67 = auVar54._8_8_;
  uVar120 = uVar67 + uStack_e0;
  uVar67 = (ulong)CARRY8(uVar67,uStack_e0);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uStack_c0;
  uVar66 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,8);
  uVar89 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,0);
  uVar104 = uVar120 + uVar89;
  uVar89 = (ulong)CARRY8(uVar120,uVar89);
  uVar109 = uVar67 + uVar66;
  uVar78 = uVar109 + uVar89;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uStack_c8;
  uVar97 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,0);
  uStack_160 = uVar104 + uVar120;
  uVar120 = (ulong)CARRY8(uVar104,uVar120);
  uVar104 = uVar78 + uVar97;
  uVar102 = uVar104 + uVar120;
  uVar79 = (ulong)(CARRY8(uVar67,uVar66) || CARRY8(uVar109,uVar89)) +
           (ulong)(CARRY8(uVar78,uVar97) || CARRY8(uVar104,uVar120));
  uVar120 = uVar102 + uStack_d8;
  uVar67 = (ulong)CARRY8(uVar102,uStack_d8);
  uVar102 = uVar79 + uVar67;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auStack_b8._0_8_;
  uVar97 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,8);
  uVar89 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,0);
  uVar109 = uVar120 + uVar89;
  uVar89 = (ulong)CARRY8(uVar120,uVar89);
  uVar104 = uVar102 + uVar97;
  uVar103 = uVar104 + uVar89;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uStack_c0;
  uVar78 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,0);
  uVar81 = uVar109 + uVar120;
  uVar120 = (ulong)CARRY8(uVar109,uVar120);
  uVar66 = uVar103 + uVar78;
  uVar80 = uVar66 + uVar120;
  uStack_168 = uVar81 + uStack_c8;
  uVar109 = (ulong)CARRY8(uVar81,uStack_c8);
  uVar81 = uVar80 + uVar109;
  uVar102 = (ulong)CARRY8(uVar79,uVar67) + (ulong)(CARRY8(uVar102,uVar97) || CARRY8(uVar104,uVar89))
            + (ulong)(CARRY8(uVar103,uVar78) || CARRY8(uVar66,uVar120)) +
            (ulong)CARRY8(uVar80,uVar109);
  uVar120 = uVar81 + uStack_d0;
  uVar67 = (ulong)CARRY8(uVar81,uStack_d0);
  uVar103 = uVar102 + uVar67;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auStack_b8._8_8_;
  uVar97 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,8);
  uVar89 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,0);
  uVar109 = uVar120 + uVar89;
  uVar89 = (ulong)CARRY8(uVar120,uVar89);
  uVar104 = uVar103 + uVar97;
  uVar80 = uVar104 + uVar89;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auStack_b8._0_8_;
  uVar78 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,0);
  uVar79 = uVar109 + uVar120;
  uVar120 = (ulong)CARRY8(uVar109,uVar120);
  uVar66 = uVar80 + uVar78;
  uVar81 = uVar66 + uVar120;
  uStack_170 = uVar79 + uStack_c0;
  uVar109 = (ulong)CARRY8(uVar79,uStack_c0);
  uVar79 = uVar81 + uVar109;
  uVar104 = (ulong)CARRY8(uVar102,uVar67) +
            (ulong)(CARRY8(uVar103,uVar97) || CARRY8(uVar104,uVar89)) +
            (ulong)(CARRY8(uVar80,uVar78) || CARRY8(uVar66,uVar120)) + (ulong)CARRY8(uVar81,uVar109)
  ;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auStack_b8._8_8_;
  uVar109 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,8);
  uVar67 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,0);
  uVar89 = uVar79 + uVar67;
  uVar67 = (ulong)CARRY8(uVar79,uVar67);
  uVar120 = uVar104 + uVar109;
  uVar66 = uVar120 + uVar67;
  auVar61._8_8_ = uVar66;
  auVar61._0_8_ = uVar89;
  uStack_178 = SUB168(auStack_b8 + auVar61,0);
  uVar89 = (ulong)CARRY8(uVar89,auStack_b8._0_8_);
  uVar105 = SUB168(auStack_b8 + auVar61,8);
  uVar79 = (ulong)(CARRY8(uVar104,uVar109) || CARRY8(uVar120,uVar67)) + (ulong)CARRY8(uVar66,uVar89)
           + (ulong)CARRY8(uVar66 + uVar89,auStack_b8._8_8_);
  auVar59._8_8_ = uVar79;
  auVar59._0_8_ = uVar105;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uStack_158;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uStack_178;
  auVar55 = ZEXT816(0x402da1732fc9bebf) * auVar45 + auVar55;
  uStack_190 = auVar55._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uStack_190;
  uVar67 = auVar55._8_8_;
  uVar120 = uVar67 + uStack_160;
  uVar67 = (ulong)CARRY8(uVar67,uStack_160);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar105;
  uVar66 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,8);
  uVar89 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,0);
  uVar104 = uVar120 + uVar89;
  uVar89 = (ulong)CARRY8(uVar120,uVar89);
  uVar109 = uVar67 + uVar66;
  uVar78 = uVar109 + uVar89;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uStack_178;
  uVar97 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,0);
  uStack_198 = uVar104 + uVar120;
  uVar120 = (ulong)CARRY8(uVar104,uVar120);
  uVar104 = uVar78 + uVar97;
  uVar103 = uVar104 + uVar120;
  uVar102 = (ulong)(CARRY8(uVar67,uVar66) || CARRY8(uVar109,uVar89)) +
            (ulong)(CARRY8(uVar78,uVar97) || CARRY8(uVar104,uVar120));
  uVar120 = uVar103 + uStack_168;
  uVar67 = (ulong)CARRY8(uVar103,uStack_168);
  uVar103 = uVar102 + uVar67;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar79;
  uVar97 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,8);
  uVar89 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,0);
  uVar109 = uVar120 + uVar89;
  uVar89 = (ulong)CARRY8(uVar120,uVar89);
  uVar104 = uVar103 + uVar97;
  uVar80 = uVar104 + uVar89;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar105;
  uVar78 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,0);
  uVar82 = uVar109 + uVar120;
  uVar120 = (ulong)CARRY8(uVar109,uVar120);
  uVar66 = uVar80 + uVar78;
  uVar81 = uVar66 + uVar120;
  uStack_1a0 = uVar82 + uStack_178;
  uVar109 = (ulong)CARRY8(uVar82,uStack_178);
  uVar82 = uVar81 + uVar109;
  auVar56._8_8_ =
       (ulong)CARRY8(uVar102,uVar67) + (ulong)(CARRY8(uVar103,uVar97) || CARRY8(uVar104,uVar89)) +
       (ulong)(CARRY8(uVar80,uVar78) || CARRY8(uVar66,uVar120)) + (ulong)CARRY8(uVar81,uVar109) +
       (ulong)CARRY8(uVar82,uStack_170);
  auVar56._0_8_ = uVar82 + uStack_170;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar79;
  auVar59 = ZEXT816(0x4551231950b75fc4) * auVar50 + auVar56 + auVar59;
  uStack_1a8 = auVar59._0_8_;
  uStack_1b0 = auVar59._8_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uStack_1b0;
  auVar62 = ZEXT816(0x402da1732fc9bebf) * auVar51 + auVar62;
  uVar67 = auVar62._8_8_;
  (psVar122->x).n[0] = auVar62._0_8_;
  auVar57[8] = CARRY8(uVar67,uStack_198);
  auVar57._0_8_ = uVar67 + uStack_198;
  auVar57._9_7_ = 0;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uStack_1b0;
  auVar57 = ZEXT816(0x4551231950b75fc4) * auVar52 + auVar57;
  uVar67 = auVar57._8_8_;
  (psVar122->x).n[1] = auVar57._0_8_;
  uVar89 = uVar67 + uStack_1b0;
  uVar109 = (ulong)CARRY8(uVar67,uStack_1b0) + (ulong)CARRY8(uVar89,uStack_1a0);
  (psVar122->x).n[2] = uVar89 + uStack_1a0;
  uVar120 = (ulong)CARRY8(uVar109,uStack_1a8);
  (psVar122->x).n[3] = uVar109 + uStack_1a8;
  uVar1 = (psVar122->x).n[3];
  uVar67 = (psVar122->x).n[2];
  uVar89 = (psVar122->x).n[1];
  uVar75 = (uint)((0xfffffffffffffffd < uVar67 && uVar1 == 0xffffffffffffffff) &&
                 0xbaaedce6af48a03a < uVar89);
  uVar90 = 0;
  if (0xbaaedce6af48a03b < uVar89) {
    uVar90 = uVar75;
  }
  psVar92 = (secp256k1_gej *)(psVar122->x).n[0];
  uVar64 = 0;
  if ((secp256k1_gej *)0xbfd25e8cd0364140 < psVar92) {
    uVar64 = uVar75;
  }
  uStack_150._0_4_ = (uint)CARRY8(uVar109,uStack_1a8);
  uVar90 = (uVar64 | uVar90 | (uVar67 == 0xffffffffffffffff && uVar1 == 0xffffffffffffffff)) +
           (uint)uStack_150;
  a_00 = (secp256k1_fe *)(ulong)uVar90;
  uStack_188 = uVar79;
  uStack_180 = uVar105;
  uStack_150 = uVar120;
  uStack_148 = uStack_1b0;
  uStack_140 = uStack_1a8;
  uStack_138 = uStack_1a0;
  uStack_130 = uStack_198;
  uStack_128 = uStack_190;
  uStack_120 = uVar79;
  uStack_118 = uVar105;
  uStack_110 = uStack_178;
  uStack_108 = uStack_170;
  uStack_100 = uStack_168;
  uStack_f8 = uStack_160;
  uStack_f0 = uStack_158;
  if (uVar90 < 2) {
    uVar120 = (ulong)uVar90;
    uVar116 = (ulong)CARRY8(uVar120 * 0x402da1732fc9bebf,(ulong)psVar92);
    uVar119 = uVar120 * 0x4551231950b75fc4 + uVar89;
    (psVar122->x).n[0] = uVar120 * 0x402da1732fc9bebf + (long)psVar92;
    (psVar122->x).n[1] = uVar119 + uVar116;
    uVar116 = (ulong)(CARRY8(uVar120 * 0x4551231950b75fc4,uVar89) || CARRY8(uVar119,uVar116));
    (psVar122->x).n[2] = uVar67 + uVar120 + uVar116;
    (psVar122->x).n[3] = uVar1 + (CARRY8(uVar67,uVar120) || CARRY8(uVar67 + uVar120,uVar116));
    pcStack_1c0 = (code *)0x1427b1;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar122);
    pcStack_1c0 = (code *)0x1427b9;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar122);
    return;
  }
  pcStack_1c0 = secp256k1_gej_eq_x_var;
  secp256k1_scalar_mul_cold_1();
  uStack_1c8 = uVar63;
  psStack_208 = (secp256k1_fe *)0x1427e4;
  psVar94 = psVar92;
  uStack_1d0 = uVar119;
  pcStack_1c0 = (code *)uVar116;
  secp256k1_fe_verify(a_00);
  psStack_208 = (secp256k1_fe *)0x1427ec;
  psVar96 = psVar92;
  secp256k1_gej_verify(psVar92);
  if (psVar92->infinity == 0) {
    psStack_208 = (secp256k1_fe *)0x142804;
    secp256k1_fe_sqr(&sStack_200,&psVar92->z);
    psStack_208 = (secp256k1_fe *)0x142812;
    secp256k1_fe_mul(&sStack_200,&sStack_200,a_00);
    psStack_208 = (secp256k1_fe *)0x14281d;
    secp256k1_fe_equal(&sStack_200,&psVar92->x);
    return;
  }
  psStack_208 = (secp256k1_fe *)secp256k1_fe_cmp_var;
  secp256k1_gej_eq_x_var_cold_1();
  psStack_220 = (secp256k1_gej *)0x14283b;
  psVar93 = psVar94;
  psStack_210 = psVar92;
  psStack_208 = a_00;
  secp256k1_fe_verify(&psVar96->x);
  psStack_220 = (secp256k1_gej *)0x142843;
  psVar92 = psVar94;
  secp256k1_fe_verify(&psVar94->x);
  if ((psVar96->x).normalized == 0) {
    psStack_220 = (secp256k1_gej *)0x142885;
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar94->x).normalized != 0) {
    uVar90 = 4;
    while( true ) {
      uVar116 = (psVar94->x).n[uVar90];
      uVar119 = (psVar96->x).n[uVar90];
      if (uVar119 >= uVar116 && uVar119 != uVar116) {
        return;
      }
      if (uVar119 < uVar116) break;
      bVar123 = uVar90 == 0;
      uVar90 = uVar90 - 1;
      if (bVar123) {
        return;
      }
    }
    return;
  }
  psStack_220 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_cmp_var_cold_1();
  psStack_238 = (secp256k1_gej *)0x142899;
  psVar77 = psVar93;
  psStack_228 = psVar94;
  psStack_220 = psVar96;
  secp256k1_fe_verify(&psVar92->x);
  psStack_238 = (secp256k1_gej *)0x1428a1;
  psVar94 = psVar93;
  secp256k1_fe_verify(&psVar93->x);
  iVar65 = (psVar93->x).magnitude + (psVar92->x).magnitude;
  if (iVar65 < 0x21) {
    (psVar92->x).n[0] = (psVar92->x).n[0] + (psVar93->x).n[0];
    puVar111 = (psVar92->x).n + 1;
    *puVar111 = *puVar111 + (psVar93->x).n[1];
    puVar111 = (psVar92->x).n + 2;
    *puVar111 = *puVar111 + (psVar93->x).n[2];
    puVar111 = (psVar92->x).n + 3;
    *puVar111 = *puVar111 + (psVar93->x).n[3];
    puVar111 = (psVar92->x).n + 4;
    *puVar111 = *puVar111 + (psVar93->x).n[4];
    (psVar92->x).magnitude = iVar65;
    (psVar92->x).normalized = 0;
    secp256k1_fe_verify(&psVar92->x);
    return;
  }
  psStack_238 = (secp256k1_gej *)secp256k1_modinv64_var;
  secp256k1_fe_add_cold_1();
  auStack_2b8._16_8_ = 0;
  auStack_2b8._24_8_ = 0;
  auStack_2b8._0_8_ = 0;
  auStack_2b8._8_8_ = 0;
  psVar96 = (secp256k1_gej *)0x0;
  auStack_2b8._32_8_ = 0;
  auStack_2b8._56_8_ = 0;
  auStack_2b8._80_8_ = 0;
  auStack_2b8._64_8_ = 0;
  auStack_2b8._72_8_ = 0;
  auStack_2b8._48_8_ = 1;
  uStack_2e8 = (psVar77->x).n[4];
  auStack_338._48_8_ = (psVar77->x).n[0];
  uStack_300 = (psVar77->x).n[1];
  uStack_2f8 = (psVar77->x).n[2];
  uStack_2f0 = (psVar77->x).n[3];
  auStack_338._32_8_ = (psVar94->x).n[4];
  auStack_338._0_8_ = (psVar94->x).n[0];
  auStack_338._8_8_ = (psVar94->x).n[1];
  auStack_338._16_8_ = (psVar94->x).n[2];
  auStack_338._24_8_ = (psVar94->x).n[3];
  lVar121 = -1;
  psVar86 = (secp256k1_gej *)0x5;
  psStack_350 = psVar94;
  apsStack_348[0] = psVar77;
  auStack_2b8._88_8_ = psVar92;
  uStack_258 = uVar105;
  uStack_250 = uVar79;
  psStack_248 = psVar93;
  uStack_240 = uVar116;
  psStack_238 = psVar122;
  do {
    psVar92 = (secp256k1_gej *)auStack_338._48_8_;
    psVar87 = apsStack_348[0];
    uStack_354 = (uint)psVar86;
    psVar68 = (secp256k1_gej *)0x0;
    psVar110 = (secp256k1_gej *)0x0;
    psVar101 = (secp256k1_gej *)0x1;
    uVar90 = 0x3e;
    psVar93 = (secp256k1_gej *)0x1;
    puVar113 = (undefined1 *)auStack_338._0_8_;
    psVar94 = (secp256k1_gej *)auStack_338._48_8_;
    while( true ) {
      a_01 = (secp256k1_gej *)(-1L << ((byte)uVar90 & 0x3f) | (ulong)puVar113);
      psVar76 = (secp256k1_gej *)0x0;
      if (a_01 != (secp256k1_gej *)0x0) {
        for (; ((ulong)a_01 >> (long)psVar76 & 1) == 0;
            psVar76 = (secp256k1_gej *)((long)(psVar76->x).n + 1)) {
        }
      }
      bVar72 = (byte)psVar76;
      psVar114 = (secp256k1_gej *)((ulong)puVar113 >> (bVar72 & 0x3f));
      psVar93 = (secp256k1_gej *)((long)psVar93 << (bVar72 & 0x3f));
      psVar68 = (secp256k1_gej *)((long)psVar68 << (bVar72 & 0x3f));
      lVar121 = lVar121 - (long)psVar76;
      uVar90 = uVar90 - (int)psVar76;
      apsStack_348[1] = psVar96;
      if (uVar90 == 0) break;
      if (((ulong)psVar94 & 1) == 0) {
        pcStack_360 = (code *)0x142e13;
        secp256k1_modinv64_var_cold_8();
LAB_00142e13:
        pcStack_360 = (code *)0x142e18;
        secp256k1_modinv64_var_cold_7();
LAB_00142e18:
        pcStack_360 = (code *)0x142e1d;
        secp256k1_modinv64_var_cold_1();
LAB_00142e1d:
        pcStack_360 = (code *)0x142e22;
        secp256k1_modinv64_var_cold_2();
LAB_00142e22:
        pcStack_360 = (code *)0x142e27;
        secp256k1_modinv64_var_cold_6();
        psVar114 = psVar94;
        goto LAB_00142e27;
      }
      if (((ulong)psVar114 & 1) == 0) goto LAB_00142e13;
      a_01 = (secp256k1_gej *)
             ((long)psVar68 * auStack_338._0_8_ + (long)psVar93 * auStack_338._48_8_);
      psVar76 = (secp256k1_gej *)(ulong)(0x3e - uVar90);
      bVar72 = (byte)(0x3e - uVar90);
      psVar86 = (secp256k1_gej *)((long)psVar94 << (bVar72 & 0x3f));
      if (a_01 != psVar86) goto LAB_00142e18;
      psVar86 = (secp256k1_gej *)
                ((long)psVar101 * auStack_338._0_8_ + (long)psVar110 * auStack_338._48_8_);
      a_01 = (secp256k1_gej *)((long)psVar114 << (bVar72 & 0x3f));
      if (psVar86 != a_01) goto LAB_00142e1d;
      psVar76 = (secp256k1_gej *)(lVar121 - 0x2ea);
      if (psVar76 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_00142e22;
      iVar65 = (int)psVar114;
      if (lVar121 < 0) {
        lVar121 = -lVar121;
        uVar75 = (int)lVar121 + 1;
        if ((int)uVar90 <= (int)uVar75) {
          uVar75 = uVar90;
        }
        psVar76 = (secp256k1_gej *)(ulong)uVar75;
        a_01 = (secp256k1_gej *)(ulong)(uVar75 - 0x3f);
        if (0xffffffc1 < uVar75 - 0x3f) {
          psVar117 = (secp256k1_gej *)-(long)psVar68;
          psVar122 = (secp256k1_gej *)-(long)psVar93;
          psVar76 = (secp256k1_gej *)-(long)psVar94;
          psVar86 = (secp256k1_gej *)
                    ((ulong)(0x3fL << (-(char)uVar75 & 0x3fU)) >> (-(char)uVar75 & 0x3fU));
          uVar75 = (iVar65 * iVar65 + 0x3e) * iVar65 * (int)psVar76 & (uint)psVar86;
          psVar68 = psVar101;
          psVar93 = psVar110;
          psVar77 = psVar117;
          goto LAB_00142aed;
        }
        goto LAB_00142e31;
      }
      uVar75 = (int)lVar121 + 1;
      if ((int)uVar90 <= (int)uVar75) {
        uVar75 = uVar90;
      }
      psVar76 = (secp256k1_gej *)(ulong)uVar75;
      a_01 = (secp256k1_gej *)(ulong)(uVar75 - 0x3f);
      if (uVar75 - 0x3f < 0xffffffc2) goto LAB_00142e2c;
      psVar86 = (secp256k1_gej *)
                ((ulong)(0xfL << (-(char)uVar75 & 0x3fU)) >> (-(char)uVar75 & 0x3fU));
      uVar75 = -(iVar65 * (((int)psVar94 * 2 + 2U & 8) + (int)psVar94)) & (uint)psVar86;
      psVar122 = psVar110;
      psVar117 = psVar101;
      psVar76 = psVar114;
      psVar114 = psVar94;
LAB_00142aed:
      uVar116 = (ulong)uVar75;
      a_01 = (secp256k1_gej *)(uVar116 * (long)psVar114);
      puVar113 = (undefined1 *)((long)(psVar76->x).n + (long)(a_01->x).n);
      psVar110 = (secp256k1_gej *)((long)(psVar122->x).n + (long)psVar93 * uVar116);
      psVar76 = (secp256k1_gej *)(uVar116 * (long)psVar68);
      psVar101 = (secp256k1_gej *)((long)(psVar117->x).n + (long)(psVar76->x).n);
      psVar94 = psVar114;
      if (((ulong)puVar113 & (ulong)psVar86) != 0) {
LAB_00142e27:
        pcStack_360 = (code *)0x142e2c;
        secp256k1_modinv64_var_cold_4();
        psVar94 = psVar114;
LAB_00142e2c:
        pcStack_360 = (code *)0x142e31;
        secp256k1_modinv64_var_cold_3();
LAB_00142e31:
        pcStack_360 = (code *)0x142e36;
        secp256k1_modinv64_var_cold_5();
        goto LAB_00142e36;
      }
    }
    a_01 = (secp256k1_gej *)((long)psVar68 * (long)psVar110);
    psVar76 = SUB168(SEXT816((long)psVar68) * SEXT816((long)psVar110),8);
    sStack_2d8.u = (int64_t)psVar93;
    sStack_2d8.v = (int64_t)psVar68;
    sStack_2d8.q = (int64_t)psVar110;
    sStack_2d8.r = (int64_t)psVar101;
    if ((long)psVar93 * (long)psVar101 - (long)a_01 != 0x4000000000000000 ||
        SUB168(SEXT816((long)psVar93) * SEXT816((long)psVar101),8) - (long)psVar76 !=
        (ulong)((secp256k1_gej *)((long)psVar93 * (long)psVar101) < a_01)) {
LAB_00142e36:
      pcStack_360 = (code *)0x142e3b;
      secp256k1_modinv64_var_cold_9();
      psVar87 = psVar77;
LAB_00142e3b:
      pcStack_360 = (code *)0x142e40;
      secp256k1_modinv64_var_cold_20();
LAB_00142e40:
      pcStack_360 = (code *)0x142e45;
      secp256k1_modinv64_var_cold_19();
LAB_00142e45:
      pcStack_360 = (code *)0x142e4a;
      secp256k1_modinv64_var_cold_18();
      psVar96 = psVar92;
LAB_00142e4a:
      pcStack_360 = (code *)0x142e4f;
      secp256k1_modinv64_var_cold_17();
LAB_00142e4f:
      pcStack_360 = (code *)0x142e54;
      secp256k1_modinv64_var_cold_14();
LAB_00142e54:
      pcStack_360 = (code *)0x142e59;
      secp256k1_modinv64_var_cold_13();
LAB_00142e59:
      pcStack_360 = (code *)0x142e5e;
      secp256k1_modinv64_var_cold_12();
LAB_00142e5e:
      pcStack_360 = (code *)0x142e63;
      secp256k1_modinv64_var_cold_11();
LAB_00142e63:
      pcStack_360 = (code *)0x142e68;
      secp256k1_modinv64_var_cold_10();
      goto LAB_00142e68;
    }
    pcStack_360 = (code *)0x142b7b;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_2b8,
               (secp256k1_modinv64_signed62 *)(auStack_2b8 + 0x30),&sStack_2d8,
               (secp256k1_modinv64_modinfo *)apsStack_348[0]);
    uVar90 = uStack_354;
    psVar94 = (secp256k1_gej *)(auStack_338 + 0x30);
    psVar86 = (secp256k1_gej *)(ulong)uStack_354;
    psVar93 = (secp256k1_gej *)(ulong)uStack_354;
    psVar76 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_360 = (code *)0x142b98;
    a_01 = psVar94;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar94,uStack_354,
                        (secp256k1_modinv64_signed62 *)psVar87,-1);
    if (iVar65 < 1) goto LAB_00142e3b;
    psVar76 = (secp256k1_gej *)0x1;
    psVar93 = (secp256k1_gej *)(ulong)uVar90;
    pcStack_360 = (code *)0x142bb2;
    a_01 = psVar94;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar94,uVar90,
                        (secp256k1_modinv64_signed62 *)psVar87,1);
    if (0 < iVar65) goto LAB_00142e40;
    psVar92 = (secp256k1_gej *)auStack_338;
    psVar93 = (secp256k1_gej *)(ulong)uVar90;
    psVar76 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_360 = (code *)0x142bd3;
    a_01 = psVar92;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar92,uVar90,
                        (secp256k1_modinv64_signed62 *)psVar87,-1);
    if (iVar65 < 1) goto LAB_00142e45;
    psVar76 = (secp256k1_gej *)0x1;
    psVar93 = (secp256k1_gej *)(ulong)uVar90;
    pcStack_360 = (code *)0x142bed;
    a_01 = psVar92;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar92,uVar90,
                        (secp256k1_modinv64_signed62 *)psVar87,1);
    psVar96 = psVar92;
    if (-1 < iVar65) goto LAB_00142e4a;
    pcStack_360 = (code *)0x142c0a;
    secp256k1_modinv64_update_fg_62_var
              (uVar90,(secp256k1_modinv64_signed62 *)psVar94,(secp256k1_modinv64_signed62 *)psVar92,
               &sStack_2d8);
    psVar96 = apsStack_348[1];
    if ((undefined1 *)auStack_338._0_8_ != (undefined1 *)0x0) {
LAB_00142c1b:
      lVar83 = (long)(int)uVar90;
      uVar116 = *(ulong *)(auStack_338 + lVar83 * 8 + 0x28);
      psVar76 = apsStack_348[lVar83 + 1];
      a_01 = (secp256k1_gej *)((long)uVar116 >> 0x3f ^ uVar116 | lVar83 + -2 >> 0x3f);
      psVar93 = (secp256k1_gej *)((long)psVar76 >> 0x3f ^ (ulong)psVar76 | (ulong)a_01);
      if (psVar93 == (secp256k1_gej *)0x0) {
        psVar86 = (secp256k1_gej *)(ulong)(uVar90 - 1);
        *(ulong *)(auStack_338 + lVar83 * 8 + 0x20) =
             *(ulong *)(auStack_338 + lVar83 * 8 + 0x20) | uVar116 << 0x3e;
        psVar76 = (secp256k1_gej *)((long)psVar76 << 0x3e);
        apsStack_348[lVar83] = (secp256k1_gej *)((ulong)apsStack_348[lVar83] | (ulong)psVar76);
      }
      if (10 < (int)psVar96) goto LAB_00142e4f;
      psVar76 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_360 = (code *)0x142c7e;
      iVar74 = (int)psVar86;
      psVar93 = psVar86;
      a_01 = psVar94;
      iVar65 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar94,iVar74,
                          (secp256k1_modinv64_signed62 *)psVar87,-1);
      if (iVar65 < 1) goto LAB_00142e54;
      psVar76 = (secp256k1_gej *)0x1;
      pcStack_360 = (code *)0x142c98;
      psVar93 = psVar86;
      a_01 = psVar94;
      iVar65 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar94,iVar74,
                          (secp256k1_modinv64_signed62 *)psVar87,1);
      if (0 < iVar65) goto LAB_00142e59;
      psVar94 = (secp256k1_gej *)auStack_338;
      psVar76 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_360 = (code *)0x142cb9;
      psVar93 = psVar86;
      a_01 = psVar94;
      iVar65 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar94,iVar74,
                          (secp256k1_modinv64_signed62 *)psVar87,-1);
      if (iVar65 < 1) goto LAB_00142e5e;
      psVar76 = (secp256k1_gej *)0x1;
      pcStack_360 = (code *)0x142cd3;
      psVar93 = psVar86;
      a_01 = psVar94;
      iVar65 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar94,iVar74,
                          (secp256k1_modinv64_signed62 *)psVar87,1);
      if (iVar65 < 0) {
        bVar123 = true;
        psVar96 = (secp256k1_gej *)(ulong)((int)psVar96 + 1);
        goto LAB_00142d08;
      }
      goto LAB_00142e63;
    }
    if (1 < (int)uVar90) {
      uVar116 = 1;
      uVar119 = 0;
      do {
        uVar119 = uVar119 | *(ulong *)(auStack_338 + uVar116 * 8);
        uVar116 = uVar116 + 1;
      } while (uVar90 != uVar116);
      if (uVar119 != 0) goto LAB_00142c1b;
    }
    bVar123 = false;
LAB_00142d08:
    psVar77 = psVar87;
  } while (bVar123);
  a_01 = (secp256k1_gej *)auStack_338;
  iVar74 = (int)psVar86;
  psVar76 = (secp256k1_gej *)0x0;
  pcStack_360 = (code *)0x142d25;
  psVar93 = psVar86;
  iVar65 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)a_01,iVar74,&SECP256K1_SIGNED62_ONE,0);
  if (iVar65 == 0) {
    pcStack_360 = (code *)0x142d47;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)(auStack_338 + 0x30),iVar74,
                        &SECP256K1_SIGNED62_ONE,-1);
    psVar96 = psStack_350;
    if (iVar65 == 0) {
LAB_00142dc9:
      pcStack_360 = (code *)0x142de4;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_2b8,
                 *(int64_t *)(auStack_338 + (long)iVar74 * 8 + 0x28),
                 (secp256k1_modinv64_modinfo *)psVar87);
      (psVar96->x).n[4] = auStack_2b8._32_8_;
      (psVar96->x).n[2] = auStack_2b8._16_8_;
      (psVar96->x).n[3] = auStack_2b8._24_8_;
      (psVar96->x).n[0] = auStack_2b8._0_8_;
      (psVar96->x).n[1] = auStack_2b8._8_8_;
      return;
    }
    pcStack_360 = (code *)0x142d68;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)(auStack_338 + 0x30),iVar74,
                        &SECP256K1_SIGNED62_ONE,1);
    if (iVar65 == 0) goto LAB_00142dc9;
    psVar93 = (secp256k1_gej *)0x5;
    psVar76 = (secp256k1_gej *)0x0;
    pcStack_360 = (code *)0x142d82;
    a_01 = psVar96;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar96,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar65 == 0) {
      a_01 = (secp256k1_gej *)auStack_2b8;
      psVar93 = (secp256k1_gej *)0x5;
      psVar76 = (secp256k1_gej *)0x0;
      pcStack_360 = (code *)0x142da5;
      iVar65 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar65 == 0) {
        a_01 = (secp256k1_gej *)(auStack_338 + 0x30);
        psVar76 = (secp256k1_gej *)0x1;
        pcStack_360 = (code *)0x142dc1;
        psVar93 = psVar86;
        iVar65 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)a_01,iVar74,
                            (secp256k1_modinv64_signed62 *)psVar87,1);
        if (iVar65 == 0) goto LAB_00142dc9;
      }
    }
  }
  else {
LAB_00142e68:
    pcStack_360 = (code *)0x142e6d;
    secp256k1_modinv64_var_cold_15();
  }
  pcStack_360 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  uVar116 = (psVar93->x).n[0];
  if (uVar116 >> 0x3e == 0) {
    uVar119 = (psVar93->x).n[1];
    if (0x3fffffffffffffff < uVar119) goto LAB_00142efc;
    psVar76 = (secp256k1_gej *)(psVar93->x).n[2];
    if ((secp256k1_gej *)0x3fffffffffffffff < psVar76) goto LAB_00142f01;
    uVar67 = (psVar93->x).n[3];
    if (0x3fffffffffffffff < uVar67) goto LAB_00142f06;
    psVar93 = (secp256k1_gej *)(psVar93->x).n[4];
    if (psVar93 < (secp256k1_gej *)&DAT_00000100) {
      (a_01->x).n[0] = uVar119 << 0x3e | uVar116;
      (a_01->x).n[1] = (long)psVar76 << 0x3c | uVar119 >> 2;
      (a_01->x).n[2] = uVar67 << 0x3a | (ulong)psVar76 >> 4;
      (a_01->x).n[3] = (long)psVar93 << 0x38 | uVar67 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_01);
      return;
    }
  }
  else {
    psStack_368 = (secp256k1_gej *)0x142efc;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00142efc:
    psStack_368 = (secp256k1_gej *)0x142f01;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00142f01:
    psStack_368 = (secp256k1_gej *)0x142f06;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00142f06:
    psStack_368 = (secp256k1_gej *)0x142f0b;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_368 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_368 = psVar122;
  lStack_370 = lVar121;
  psStack_378 = psVar96;
  psStack_380 = psVar94;
  psStack_388 = psVar87;
  psStack_390 = psVar86;
  uVar1 = (a_01->x).n[0];
  psStack_3a0 = (secp256k1_gej *)(a_01->x).n[1];
  psStack_3b0 = (secp256k1_gej *)(a_01->x).n[2];
  uStack_3d0 = (a_01->x).n[3];
  psStack_3c0 = (secp256k1_gej *)(a_01->x).n[4];
  psVar122 = (secp256k1_gej *)(psVar93->x).n[0];
  psStack_398 = (secp256k1_gej *)(psVar93->x).n[1];
  uStack_3a8 = (psVar93->x).n[2];
  uStack_408 = *extraout_RDX;
  psStack_400 = (secp256k1_gej *)extraout_RDX[1];
  uStack_418 = extraout_RDX[2];
  psStack_410 = (secp256k1_gej *)extraout_RDX[3];
  psVar92 = (secp256k1_gej *)(psVar93->x).n[3];
  psStack_3c8 = (secp256k1_gej *)(psVar93->x).n[4];
  psVar94 = (secp256k1_gej *)0x5;
  psVar77 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_420 = (secp256k1_gej *)0x142fac;
  psVar96 = a_01;
  iVar65 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar76,
                      -2);
  if (iVar65 < 1) {
    psStack_420 = (secp256k1_gej *)0x143acc;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_00143acc:
    psStack_420 = (secp256k1_gej *)0x143ad1;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00143ad1:
    psStack_420 = (secp256k1_gej *)0x143ad6;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00143ad6:
    psStack_420 = (secp256k1_gej *)0x143adb;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_00143adb:
    psStack_420 = (secp256k1_gej *)0x143ae0;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_00143ae0:
    psStack_420 = (secp256k1_gej *)0x143ae5;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00143ae5:
    psStack_420 = (secp256k1_gej *)0x143aea;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_00143aea:
    psStack_420 = (secp256k1_gej *)0x143aef;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar86 = psVar76;
LAB_00143aef:
    psStack_420 = (secp256k1_gej *)0x143af4;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00143af4:
    psStack_420 = (secp256k1_gej *)0x143af9;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_00143af9:
    psStack_420 = (secp256k1_gej *)0x143afe;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar87 = psVar86;
LAB_00143afe:
    psStack_420 = (secp256k1_gej *)0x143b03;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00143b03:
    psStack_420 = (secp256k1_gej *)0x143b08;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00143b08:
    psStack_420 = (secp256k1_gej *)0x143b0d;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_00143b0d:
    psStack_420 = (secp256k1_gej *)0x143b12;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00143b12:
    psStack_420 = (secp256k1_gej *)0x143b17;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00143b17:
    psStack_420 = (secp256k1_gej *)0x143b1c;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_00143b1c:
    psStack_420 = (secp256k1_gej *)0x143b21;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00143b21:
    psStack_420 = (secp256k1_gej *)0x143b26;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00143b26:
    psStack_420 = (secp256k1_gej *)0x143b2b;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_00143b2b:
    psStack_420 = (secp256k1_gej *)0x143b30;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_00143b30:
    psVar92 = psVar122;
    psVar93 = a_01;
    psStack_420 = (secp256k1_gej *)0x143b35;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_00143b35:
    psStack_420 = (secp256k1_gej *)0x143b3a;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_00143b3a:
    psStack_420 = (secp256k1_gej *)0x143b3f;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_00143b3f:
    psStack_420 = (secp256k1_gej *)0x143b44;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_00143b44:
    psStack_420 = (secp256k1_gej *)0x143b49;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_00143b49:
    psStack_420 = (secp256k1_gej *)0x143b4e;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_00143b4e:
    psStack_420 = (secp256k1_gej *)0x143b53;
    secp256k1_modinv64_update_de_62_cold_23();
    a_01 = psVar93;
    psVar68 = psVar92;
LAB_00143b53:
    psStack_420 = (secp256k1_gej *)0x143b58;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_00143b58:
    psStack_420 = (secp256k1_gej *)0x143b5d;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_00143b5d:
    psStack_420 = (secp256k1_gej *)0x143b62;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_00143b62:
    psVar86 = psVar77;
    psStack_420 = (secp256k1_gej *)0x143b67;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_00143b67:
    uVar90 = (uint)psVar94;
    psStack_420 = (secp256k1_gej *)0x143b6c;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar77 = (secp256k1_gej *)0x1;
    psVar94 = (secp256k1_gej *)0x5;
    psStack_420 = (secp256k1_gej *)0x142fc9;
    psVar96 = a_01;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar76
                        ,1);
    if (-1 < iVar65) goto LAB_00143acc;
    psVar94 = (secp256k1_gej *)0x5;
    psVar77 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_420 = (secp256k1_gej *)0x142fe8;
    psVar96 = psVar93;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar93,5,
                        (secp256k1_modinv64_signed62 *)psVar76,-2);
    if (iVar65 < 1) goto LAB_00143ad1;
    psVar77 = (secp256k1_gej *)0x1;
    psVar94 = (secp256k1_gej *)0x5;
    psStack_420 = (secp256k1_gej *)0x143005;
    psVar96 = psVar93;
    iVar65 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar93,5,
                        (secp256k1_modinv64_signed62 *)psVar76,1);
    if (-1 < iVar65) goto LAB_00143ad6;
    psStack_420 = (secp256k1_gej *)0x14302b;
    psStack_3e0 = a_01;
    psStack_3b8 = psVar92;
    iVar69 = secp256k1_modinv64_abs(uStack_408);
    psStack_420 = (secp256k1_gej *)0x143038;
    psVar96 = psStack_400;
    iVar70 = secp256k1_modinv64_abs((int64_t)psStack_400);
    psVar77 = (secp256k1_gej *)(0x4000000000000000 - iVar70);
    a_01 = (secp256k1_gej *)0x3fffffffffffffff;
    if ((long)psVar77 < iVar69) goto LAB_00143adb;
    psStack_420 = (secp256k1_gej *)0x143053;
    iVar69 = secp256k1_modinv64_abs(uStack_418);
    psStack_420 = (secp256k1_gej *)0x143060;
    psVar96 = psStack_410;
    iVar70 = secp256k1_modinv64_abs((int64_t)psStack_410);
    psVar92 = psStack_3e0;
    psVar77 = (secp256k1_gej *)(0x4000000000000000 - iVar70);
    if ((long)psVar77 < iVar69) goto LAB_00143ae0;
    a_01 = (secp256k1_gej *)0x7fffffffffffffff;
    psVar94 = (secp256k1_gej *)(uStack_408 * uVar1);
    psVar77 = SUB168(SEXT816((long)uStack_408) * SEXT816((long)uVar1),8);
    uVar116 = (long)psStack_400 * (long)psVar122;
    lVar83 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)psVar122),8);
    lVar121 = (0x7fffffffffffffff - lVar83) - (long)psVar77;
    if (-1 < lVar83 &&
        (SBORROW8(0x7fffffffffffffff - lVar83,(long)psVar77) !=
        SBORROW8(lVar121,(ulong)((secp256k1_gej *)~uVar116 < psVar94))) !=
        (long)(lVar121 - (ulong)((secp256k1_gej *)~uVar116 < psVar94)) < 0) goto LAB_00143ae5;
    puVar111 = (uint64_t *)((long)(psVar94->x).n + uVar116);
    lVar112 = (long)(psVar77->x).n + (ulong)CARRY8(uVar116,(ulong)psVar94) + lVar83;
    uVar119 = uStack_418 * uVar1;
    lVar84 = SUB168(SEXT816((long)uStack_418) * SEXT816((long)uVar1),8);
    uVar67 = (long)psStack_410 * (long)psVar122;
    lVar85 = SUB168(SEXT816((long)psStack_410) * SEXT816((long)psVar122),8);
    uVar116 = (ulong)(-uVar67 - 1 < uVar119);
    lVar121 = (0x7fffffffffffffff - lVar85) - lVar84;
    lVar83 = lVar121 - uVar116;
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar85,lVar84) != SBORROW8(lVar121,uVar116)) ==
              lVar83 < 0;
    psVar77 = (secp256k1_gej *)CONCAT71((int7)((ulong)lVar83 >> 8),lVar85 < 0 || bVar123);
    if (lVar85 >= 0 && !bVar123) goto LAB_00143aea;
    psVar86 = (secp256k1_gej *)((long)psStack_3c8 >> 0x3f);
    lStack_3f0 = ((ulong)psStack_400 & (ulong)psVar86) + (uStack_408 & (long)psStack_3c0 >> 0x3f);
    uVar89 = uVar67 + uVar119;
    psVar96 = (secp256k1_gej *)(lVar85 + lVar84 + (ulong)CARRY8(uVar67,uVar119));
    uVar1 = (psVar76->x).n[0];
    psVar94 = *(secp256k1_gej **)&(psVar76->x).magnitude;
    psVar77 = (secp256k1_gej *)0x3fffffffffffffff;
    lStack_3f0 = lStack_3f0 - ((long)psVar94 * (long)puVar111 + lStack_3f0 & 0x3fffffffffffffffU);
    uVar119 = lStack_3f0 * uVar1;
    lVar83 = SUB168(SEXT816(lStack_3f0) * SEXT816((long)uVar1),8);
    uVar116 = (ulong)((undefined1 *)(-uVar119 - 1) < puVar111);
    lVar121 = (0x7fffffffffffffff - lVar83) - lVar112;
    psVar122 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar119 != 0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar112) != SBORROW8(lVar121,uVar116)) ==
              (long)(lVar121 - uVar116) < 0;
    if (lVar83 < 0) {
      bVar123 = (SBORROW8(lVar112,(long)psVar122) !=
                SBORROW8(lVar112 - (long)psVar122,(ulong)(puVar111 < (undefined1 *)-uVar119))) ==
                (long)((lVar112 - (long)psVar122) - (ulong)(puVar111 < (undefined1 *)-uVar119)) < 0;
    }
    psStack_3e8 = psVar93;
    psStack_3d8 = psVar76;
    if (!bVar123) goto LAB_00143aef;
    lVar121 = ((ulong)psVar86 & (ulong)psStack_410) + ((long)psStack_3c0 >> 0x3f & uStack_418);
    psVar86 = (secp256k1_gej *)(lVar121 - ((long)psVar94 * uVar89 + lVar121 & 0x3fffffffffffffff));
    lVar84 = lVar83 + lVar112 + (ulong)CARRY8(uVar119,(ulong)puVar111);
    uVar67 = (long)psVar86 * uVar1;
    lVar83 = SUB168(SEXT816((long)psVar86) * SEXT816((long)uVar1),8);
    uVar116 = (ulong)(-uVar67 - 1 < uVar89);
    lVar121 = (0x7fffffffffffffff - lVar83) - (long)psVar96;
    psVar94 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar67 != 0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,(long)psVar96) != SBORROW8(lVar121,uVar116)) ==
              (long)(lVar121 - uVar116) < 0;
    if (lVar83 < 0) {
      bVar123 = (SBORROW8((long)psVar96,(long)psVar94) !=
                SBORROW8((long)psVar96 - (long)psVar94,(ulong)(uVar89 < -uVar67))) ==
                (long)(((long)psVar96 - (long)psVar94) - (ulong)(uVar89 < -uVar67)) < 0;
    }
    if (!bVar123) goto LAB_00143af4;
    lVar121 = (long)(psVar96->x).n + (ulong)CARRY8(uVar67,uVar89) + lVar83;
    if (((long)puVar111 + uVar119 & 0x3fffffffffffffff) != 0) goto LAB_00143af9;
    psVar87 = psVar86;
    if ((uVar67 + uVar89 & 0x3fffffffffffffff) != 0) goto LAB_00143afe;
    psVar87 = (secp256k1_gej *)0x8000000000000000;
    uVar116 = (ulong)((long)puVar111 + uVar119) >> 0x3e | lVar84 * 4;
    psVar77 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar120 = uStack_408 * (long)psStack_3a0 + uVar116;
    psVar96 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_408) * SEXT816((long)psStack_3a0),8) + (lVar84 >> 0x3e) +
              (ulong)CARRY8(uStack_408 * (long)psStack_3a0,uVar116));
    uVar119 = (long)psStack_400 * (long)psStack_398;
    lVar85 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)psStack_398),8);
    uVar116 = (ulong)(-uVar119 - 1 < uVar120);
    lVar83 = (0x7fffffffffffffff - lVar85) - (long)psVar96;
    lVar112 = (-0x8000000000000000 - lVar85) - (ulong)(uVar119 != 0);
    lVar84 = (long)psVar96 - lVar112;
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar85,(long)psVar96) != SBORROW8(lVar83,uVar116)) ==
              (long)(lVar83 - uVar116) < 0;
    if (lVar85 < 0) {
      bVar123 = (SBORROW8((long)psVar96,lVar112) != SBORROW8(lVar84,(ulong)(uVar120 < -uVar119))) ==
                (long)(lVar84 - (ulong)(uVar120 < -uVar119)) < 0;
    }
    psVar94 = (secp256k1_gej *)(ulong)bVar123;
    a_01 = psStack_3a0;
    psVar122 = psStack_398;
    psStack_3f8 = psVar86;
    if (bVar123 == false) goto LAB_00143b03;
    uVar116 = uVar67 + uVar89 >> 0x3e | lVar121 * 4;
    uVar67 = uVar120 + uVar119;
    psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)CARRY8(uVar120,uVar119) + lVar85);
    uVar89 = uStack_418 * (long)psStack_3a0 + uVar116;
    lVar85 = SUB168(SEXT816((long)uStack_418) * SEXT816((long)psStack_3a0),8) + (lVar121 >> 0x3e) +
             (ulong)CARRY8(uStack_418 * (long)psStack_3a0,uVar116);
    uVar119 = (long)psStack_410 * (long)psStack_398;
    lVar84 = SUB168(SEXT816((long)psStack_410) * SEXT816((long)psStack_398),8);
    uVar116 = (ulong)(-uVar119 - 1 < uVar89);
    lVar121 = (0x7fffffffffffffff - lVar84) - lVar85;
    lVar112 = (-0x8000000000000000 - lVar84) - (ulong)(uVar119 != 0);
    lVar83 = lVar85 - lVar112;
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar85) != SBORROW8(lVar121,uVar116)) ==
              (long)(lVar121 - uVar116) < 0;
    if (lVar84 < 0) {
      bVar123 = (SBORROW8(lVar85,lVar112) != SBORROW8(lVar83,(ulong)(uVar89 < -uVar119))) ==
                (long)(lVar83 - (ulong)(uVar89 < -uVar119)) < 0;
    }
    psVar94 = (secp256k1_gej *)(ulong)bVar123;
    if (bVar123 == false) goto LAB_00143b08;
    a_01 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar116 = uVar89 + uVar119;
    lVar121 = lVar85 + lVar84 + (ulong)CARRY8(uVar89,uVar119);
    uVar1 = (psVar76->x).n[1];
    if (uVar1 != 0) {
      uVar89 = uVar1 * lStack_3f0;
      lVar84 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_3f0),8);
      uVar119 = (ulong)(-uVar89 - 1 < uVar67);
      lVar83 = (0x7fffffffffffffff - lVar84) - (long)psVar96;
      psVar94 = (secp256k1_gej *)((-0x8000000000000000 - lVar84) - (ulong)(uVar89 != 0));
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar96) != SBORROW8(lVar83,uVar119)) ==
                (long)(lVar83 - uVar119) < 0;
      if (lVar84 < 0) {
        bVar123 = (SBORROW8((long)psVar96,(long)psVar94) !=
                  SBORROW8((long)psVar96 - (long)psVar94,(ulong)(uVar67 < -uVar89))) ==
                  (long)(((long)psVar96 - (long)psVar94) - (ulong)(uVar67 < -uVar89)) < 0;
      }
      psVar77 = psVar86;
      psVar68 = psStack_398;
      if (!bVar123) goto LAB_00143b53;
      uVar120 = uVar1 * (long)psVar86;
      lVar112 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar86),8);
      uVar119 = (ulong)(-uVar120 - 1 < uVar116);
      lVar83 = (0x7fffffffffffffff - lVar112) - lVar121;
      lVar118 = (-0x8000000000000000 - lVar112) - (ulong)(uVar120 != 0);
      lVar85 = lVar121 - lVar118;
      psVar68 = (secp256k1_gej *)(lVar85 - (ulong)(uVar116 < -uVar120));
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar112,lVar121) != SBORROW8(lVar83,uVar119)) ==
                (long)(lVar83 - uVar119) < 0;
      if (lVar112 < 0) {
        bVar123 = (SBORROW8(lVar121,lVar118) != SBORROW8(lVar85,(ulong)(uVar116 < -uVar120))) ==
                  (long)psVar68 < 0;
      }
      psVar94 = (secp256k1_gej *)(ulong)bVar123;
      if (bVar123 != false) {
        bVar123 = CARRY8(uVar67,uVar89);
        uVar67 = uVar67 + uVar89;
        psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)bVar123 + lVar84);
        bVar123 = CARRY8(uVar116,uVar120);
        uVar116 = uVar116 + uVar120;
        lVar121 = lVar121 + lVar112 + (ulong)bVar123;
        goto LAB_00143427;
      }
      goto LAB_00143b58;
    }
LAB_00143427:
    uVar119 = (long)psVar96 << 2 | uVar67 >> 0x3e;
    uVar120 = uStack_408 * (long)psStack_3b0 + uVar119;
    psVar96 = (secp256k1_gej *)
              (((long)psVar96 >> 0x3e) +
               SUB168(SEXT816((long)uStack_408) * SEXT816((long)psStack_3b0),8) +
              (ulong)CARRY8(uStack_408 * (long)psStack_3b0,uVar119));
    uVar89 = (long)psStack_400 * uStack_3a8;
    lVar85 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)uStack_3a8),8);
    uVar119 = (ulong)(-uVar89 - 1 < uVar120);
    lVar83 = (0x7fffffffffffffff - lVar85) - (long)psVar96;
    lVar112 = (-0x8000000000000000 - lVar85) - (ulong)(uVar89 != 0);
    lVar84 = (long)psVar96 - lVar112;
    (psStack_3e0->x).n[0] = uVar67 & 0x3fffffffffffffff;
    (psVar93->x).n[0] = uVar116 & 0x3fffffffffffffff;
    bVar123 = (SBORROW8((long)psVar96,lVar112) != SBORROW8(lVar84,(ulong)(uVar120 < -uVar89))) ==
              (long)(lVar84 - (ulong)(uVar120 < -uVar89)) < 0;
    psVar94 = (secp256k1_gej *)(ulong)bVar123;
    bVar58 = (SBORROW8(0x7fffffffffffffff - lVar85,(long)psVar96) != SBORROW8(lVar83,uVar119)) ==
             (long)(lVar83 - uVar119) < 0;
    if (lVar85 < 0) {
      bVar58 = bVar123;
    }
    psVar77 = psStack_3b0;
    psVar122 = psStack_3e0;
    if (!bVar58) goto LAB_00143b0d;
    uVar116 = uVar116 >> 0x3e | lVar121 << 2;
    uVar109 = uVar120 + uVar89;
    psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)CARRY8(uVar120,uVar89) + lVar85);
    uVar67 = uStack_418 * (long)psStack_3b0 + uVar116;
    lVar84 = SUB168(SEXT816((long)uStack_418) * SEXT816((long)psStack_3b0),8) + (lVar121 >> 0x3e) +
             (ulong)CARRY8(uStack_418 * (long)psStack_3b0,uVar116);
    uVar119 = (long)psStack_410 * uStack_3a8;
    lVar83 = SUB168(SEXT816((long)psStack_410) * SEXT816((long)uStack_3a8),8);
    uVar116 = (ulong)(-uVar119 - 1 < uVar67);
    lVar121 = (0x7fffffffffffffff - lVar83) - lVar84;
    psVar77 = (secp256k1_gej *)0x8000000000000000;
    psVar87 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar119 != 0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar84) != SBORROW8(lVar121,uVar116)) ==
              (long)(lVar121 - uVar116) < 0;
    if (lVar83 < 0) {
      bVar123 = (SBORROW8(lVar84,(long)psVar87) !=
                SBORROW8(lVar84 - (long)psVar87,(ulong)(uVar67 < -uVar119))) ==
                (long)((lVar84 - (long)psVar87) - (ulong)(uVar67 < -uVar119)) < 0;
    }
    psVar94 = (secp256k1_gej *)(ulong)bVar123;
    if (bVar123 == false) goto LAB_00143b12;
    uVar116 = uVar67 + uVar119;
    lVar121 = lVar84 + lVar83 + (ulong)CARRY8(uVar67,uVar119);
    uVar1 = (psVar76->x).n[2];
    if (uVar1 != 0) {
      uVar67 = uVar1 * lStack_3f0;
      lVar84 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_3f0),8);
      uVar119 = (ulong)(-uVar67 - 1 < uVar109);
      lVar83 = (0x7fffffffffffffff - lVar84) - (long)psVar96;
      psVar94 = (secp256k1_gej *)((-0x8000000000000000 - lVar84) - (ulong)(uVar67 != 0));
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar96) != SBORROW8(lVar83,uVar119)) ==
                (long)(lVar83 - uVar119) < 0;
      if (lVar84 < 0) {
        bVar123 = (SBORROW8((long)psVar96,(long)psVar94) !=
                  SBORROW8((long)psVar96 - (long)psVar94,(ulong)(uVar109 < -uVar67))) ==
                  (long)(((long)psVar96 - (long)psVar94) - (ulong)(uVar109 < -uVar67)) < 0;
      }
      psVar68 = psStack_3e0;
      if (!bVar123) goto LAB_00143b5d;
      uVar89 = uVar1 * (long)psVar86;
      lVar112 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar86),8);
      uVar119 = (ulong)(-uVar89 - 1 < uVar116);
      lVar83 = (0x7fffffffffffffff - lVar112) - lVar121;
      lVar118 = (-0x8000000000000000 - lVar112) - (ulong)(uVar89 != 0);
      lVar85 = lVar121 - lVar118;
      psVar68 = (secp256k1_gej *)
                (ulong)((SBORROW8(lVar121,lVar118) != SBORROW8(lVar85,(ulong)(uVar116 < -uVar89)))
                       == (long)(lVar85 - (ulong)(uVar116 < -uVar89)) < 0);
      psVar94 = (secp256k1_gej *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar112,lVar121) != SBORROW8(lVar83,uVar119))
                       == (long)(lVar83 - uVar119) < 0);
      if (lVar112 < 0) {
        psVar94 = psVar68;
      }
      if ((char)psVar94 != '\0') {
        bVar123 = CARRY8(uVar109,uVar67);
        uVar109 = uVar109 + uVar67;
        psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)bVar123 + lVar84);
        bVar123 = CARRY8(uVar116,uVar89);
        uVar116 = uVar116 + uVar89;
        lVar121 = lVar121 + lVar112 + (ulong)bVar123;
        goto LAB_00143621;
      }
      goto LAB_00143b62;
    }
LAB_00143621:
    a_01 = (secp256k1_gej *)0x8000000000000000;
    psVar87 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar119 = (long)psVar96 << 2 | uVar109 >> 0x3e;
    uVar89 = uStack_408 * uStack_3d0 + uVar119;
    psVar96 = (secp256k1_gej *)
              (((long)psVar96 >> 0x3e) +
               SUB168(SEXT816((long)uStack_408) * SEXT816((long)uStack_3d0),8) +
              (ulong)CARRY8(uStack_408 * uStack_3d0,uVar119));
    uVar67 = (long)psStack_400 * (long)psStack_3b8;
    lVar85 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)psStack_3b8),8);
    uVar119 = (ulong)(-uVar67 - 1 < uVar89);
    lVar83 = (0x7fffffffffffffff - lVar85) - (long)psVar96;
    lVar112 = (-0x8000000000000000 - lVar85) - (ulong)(uVar67 != 0);
    lVar84 = (long)psVar96 - lVar112;
    (psStack_3e0->x).n[1] = uVar109 & 0x3fffffffffffffff;
    (psVar93->x).n[1] = uVar116 & 0x3fffffffffffffff;
    bVar123 = (SBORROW8((long)psVar96,lVar112) != SBORROW8(lVar84,(ulong)(uVar89 < -uVar67))) ==
              (long)(lVar84 - (ulong)(uVar89 < -uVar67)) < 0;
    psVar94 = (secp256k1_gej *)(ulong)bVar123;
    bVar58 = (SBORROW8(0x7fffffffffffffff - lVar85,(long)psVar96) != SBORROW8(lVar83,uVar119)) ==
             (long)(lVar83 - uVar119) < 0;
    if (lVar85 < 0) {
      bVar58 = bVar123;
    }
    psVar77 = psStack_3b8;
    if (!bVar58) goto LAB_00143b17;
    uVar116 = uVar116 >> 0x3e | lVar121 << 2;
    uVar120 = uVar89 + uVar67;
    psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)CARRY8(uVar89,uVar67) + lVar85);
    uVar67 = uStack_418 * uStack_3d0 + uVar116;
    lVar84 = SUB168(SEXT816((long)uStack_418) * SEXT816((long)uStack_3d0),8) + (lVar121 >> 0x3e) +
             (ulong)CARRY8(uStack_418 * uStack_3d0,uVar116);
    uVar119 = (long)psStack_410 * (long)psStack_3b8;
    lVar83 = SUB168(SEXT816((long)psStack_410) * SEXT816((long)psStack_3b8),8);
    uVar116 = (ulong)(-uVar119 - 1 < uVar67);
    lVar121 = (0x7fffffffffffffff - lVar83) - lVar84;
    psVar87 = (secp256k1_gej *)(lVar121 - uVar116);
    psVar77 = (secp256k1_gej *)0x8000000000000000;
    a_01 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar119 != 0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar84) != SBORROW8(lVar121,uVar116)) ==
              (long)psVar87 < 0;
    if (lVar83 < 0) {
      bVar123 = (SBORROW8(lVar84,(long)a_01) !=
                SBORROW8(lVar84 - (long)a_01,(ulong)(uVar67 < -uVar119))) ==
                (long)((lVar84 - (long)a_01) - (ulong)(uVar67 < -uVar119)) < 0;
    }
    psVar94 = (secp256k1_gej *)(ulong)bVar123;
    if (bVar123 == false) goto LAB_00143b1c;
    uVar116 = uVar67 + uVar119;
    lVar121 = lVar84 + lVar83 + (ulong)CARRY8(uVar67,uVar119);
    uVar1 = (psVar76->x).n[3];
    if (uVar1 == 0) {
LAB_00143804:
      a_01 = (secp256k1_gej *)0x8000000000000000;
      uVar119 = (long)psVar96 << 2 | uVar120 >> 0x3e;
      uVar89 = uStack_408 * (long)psStack_3c0 + uVar119;
      psVar96 = (secp256k1_gej *)
                (((long)psVar96 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_408) * SEXT816((long)psStack_3c0),8) +
                (ulong)CARRY8(uStack_408 * (long)psStack_3c0,uVar119));
      uVar67 = (long)psStack_400 * (long)psStack_3c8;
      lVar85 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)psStack_3c8),8);
      uVar119 = (ulong)(-uVar67 - 1 < uVar89);
      lVar83 = (0x7fffffffffffffff - lVar85) - (long)psVar96;
      lVar112 = (-0x8000000000000000 - lVar85) - (ulong)(uVar67 != 0);
      lVar84 = (long)psVar96 - lVar112;
      (psStack_3e0->x).n[2] = uVar120 & 0x3fffffffffffffff;
      (psVar93->x).n[2] = uVar116 & 0x3fffffffffffffff;
      bVar123 = (SBORROW8((long)psVar96,lVar112) != SBORROW8(lVar84,(ulong)(uVar89 < -uVar67))) ==
                (long)(lVar84 - (ulong)(uVar89 < -uVar67)) < 0;
      psVar94 = (secp256k1_gej *)(ulong)bVar123;
      bVar58 = (SBORROW8(0x7fffffffffffffff - lVar85,(long)psVar96) != SBORROW8(lVar83,uVar119)) ==
               (long)(lVar83 - uVar119) < 0;
      if (lVar85 < 0) {
        bVar58 = bVar123;
      }
      psVar77 = psStack_3c8;
      psVar87 = psStack_3c0;
      if (!bVar58) goto LAB_00143b21;
      uVar116 = uVar116 >> 0x3e | lVar121 << 2;
      uVar120 = uVar89 + uVar67;
      psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)CARRY8(uVar89,uVar67) + lVar85);
      uVar67 = uStack_418 * (long)psStack_3c0 + uVar116;
      lVar85 = SUB168(SEXT816((long)uStack_418) * SEXT816((long)psStack_3c0),8) + (lVar121 >> 0x3e)
               + (ulong)CARRY8(uStack_418 * (long)psStack_3c0,uVar116);
      uVar119 = (long)psStack_410 * (long)psStack_3c8;
      lVar84 = SUB168(SEXT816((long)psStack_410) * SEXT816((long)psStack_3c8),8);
      uVar116 = (ulong)(-uVar119 - 1 < uVar67);
      lVar121 = (0x7fffffffffffffff - lVar84) - lVar85;
      lVar112 = (-0x8000000000000000 - lVar84) - (ulong)(uVar119 != 0);
      lVar83 = lVar85 - lVar112;
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar85) != SBORROW8(lVar121,uVar116)) ==
                (long)(lVar121 - uVar116) < 0;
      if (lVar84 < 0) {
        bVar123 = (SBORROW8(lVar85,lVar112) != SBORROW8(lVar83,(ulong)(uVar67 < -uVar119))) ==
                  (long)(lVar83 - (ulong)(uVar67 < -uVar119)) < 0;
      }
      psVar94 = (secp256k1_gej *)(ulong)bVar123;
      if (bVar123 == false) goto LAB_00143b26;
      uVar89 = uVar67 + uVar119;
      lVar83 = lVar85 + lVar84 + (ulong)CARRY8(uVar67,uVar119);
      uVar1 = (psVar76->x).n[4];
      uVar119 = uVar1 * lStack_3f0;
      psVar94 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_3f0),8);
      uVar116 = (ulong)(-uVar119 - 1 < uVar120);
      lVar121 = (0x7fffffffffffffff - (long)psVar94) - (long)psVar96;
      psVar122 = (secp256k1_gej *)((-0x8000000000000000 - (long)psVar94) - (ulong)(uVar119 != 0));
      bVar123 = (SBORROW8(0x7fffffffffffffff - (long)psVar94,(long)psVar96) !=
                SBORROW8(lVar121,uVar116)) == (long)(lVar121 - uVar116) < 0;
      if ((long)psVar94 < 0) {
        bVar123 = (SBORROW8((long)psVar96,(long)psVar122) !=
                  SBORROW8((long)psVar96 - (long)psVar122,(ulong)(uVar120 < -uVar119))) ==
                  (long)(((long)psVar96 - (long)psVar122) - (ulong)(uVar120 < -uVar119)) < 0;
      }
      if (!bVar123) goto LAB_00143b2b;
      uVar67 = uVar1 * (long)psVar86;
      lVar84 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar86),8);
      psVar87 = (secp256k1_gej *)0x8000000000000000;
      uVar116 = (ulong)(-uVar67 - 1 < uVar89);
      lVar121 = (0x7fffffffffffffff - lVar84) - lVar83;
      a_01 = (secp256k1_gej *)((-0x8000000000000000 - lVar84) - (ulong)(uVar67 != 0));
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar83) != SBORROW8(lVar121,uVar116)) ==
                (long)(lVar121 - uVar116) < 0;
      if (lVar84 < 0) {
        bVar123 = (SBORROW8(lVar83,(long)a_01) !=
                  SBORROW8(lVar83 - (long)a_01,(ulong)(uVar89 < -uVar67))) ==
                  (long)((lVar83 - (long)a_01) - (ulong)(uVar89 < -uVar67)) < 0;
      }
      psVar77 = (secp256k1_gej *)(ulong)bVar123;
      if (bVar123 == false) goto LAB_00143b30;
      lVar85 = (long)(psVar94->x).n + (ulong)CARRY8(uVar119,uVar120) + (long)(psVar96->x).n;
      lVar121 = lVar84 + lVar83 + (ulong)CARRY8(uVar67,uVar89);
      psVar77 = (secp256k1_gej *)(lVar85 * 4 | uVar119 + uVar120 >> 0x3e);
      (psStack_3e0->x).n[3] = uVar119 + uVar120 & 0x3fffffffffffffff;
      (psVar93->x).n[3] = uVar67 + uVar89 & 0x3fffffffffffffff;
      psVar96 = (secp256k1_gej *)&psVar77[0xd79435e50d7943].x.magnitude;
      psVar94 = (secp256k1_gej *)
                ((lVar85 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar77));
      if (psVar94 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_00143b35;
      psVar94 = (secp256k1_gej *)0xffffffffffffffff;
      uVar116 = uVar67 + uVar89 >> 0x3e | lVar121 * 4;
      (psStack_3e0->x).n[4] = (uint64_t)psVar77;
      psVar87 = (secp256k1_gej *)(uVar116 + 0x8000000000000000);
      if ((lVar121 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar116) != -1) goto LAB_00143b3a;
      (psVar93->x).n[4] = uVar116;
      psVar94 = (secp256k1_gej *)0x5;
      psVar77 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_420 = (secp256k1_gej *)0x143a54;
      psVar96 = psStack_3e0;
      iVar65 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psStack_3e0,5,
                          (secp256k1_modinv64_signed62 *)psVar76,-2);
      if (iVar65 < 1) goto LAB_00143b3f;
      psVar77 = (secp256k1_gej *)0x1;
      psVar94 = (secp256k1_gej *)0x5;
      psStack_420 = (secp256k1_gej *)0x143a71;
      psVar96 = psVar92;
      iVar65 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar92,5,
                          (secp256k1_modinv64_signed62 *)psVar76,1);
      if (-1 < iVar65) goto LAB_00143b44;
      psVar94 = (secp256k1_gej *)0x5;
      psVar77 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_420 = (secp256k1_gej *)0x143a90;
      psVar96 = psVar93;
      iVar65 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar93,5,
                          (secp256k1_modinv64_signed62 *)psVar76,-2);
      if (iVar65 < 1) goto LAB_00143b49;
      psVar77 = (secp256k1_gej *)0x1;
      psVar94 = (secp256k1_gej *)0x5;
      psStack_420 = (secp256k1_gej *)0x143aad;
      psVar96 = psVar93;
      iVar65 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar93,5,
                          (secp256k1_modinv64_signed62 *)psVar76,1);
      if (iVar65 < 0) {
        return;
      }
      goto LAB_00143b4e;
    }
    psVar87 = (secp256k1_gej *)(uVar1 * lStack_3f0);
    lVar84 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_3f0),8);
    uVar119 = (ulong)(-(long)psVar87 - 1U < uVar120);
    lVar83 = (0x7fffffffffffffff - lVar84) - (long)psVar96;
    a_01 = (secp256k1_gej *)0x8000000000000000;
    psVar94 = (secp256k1_gej *)
              ((-0x8000000000000000 - lVar84) - (ulong)(psVar87 != (secp256k1_gej *)0x0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar96) != SBORROW8(lVar83,uVar119)) ==
              (long)(lVar83 - uVar119) < 0;
    if (lVar84 < 0) {
      bVar123 = (SBORROW8((long)psVar96,(long)psVar94) !=
                SBORROW8((long)psVar96 - (long)psVar94,(ulong)(uVar120 < (ulong)-(long)psVar87))) ==
                (long)(((long)psVar96 - (long)psVar94) - (ulong)(uVar120 < (ulong)-(long)psVar87)) <
                0;
    }
    psVar68 = psStack_3e0;
    if (!bVar123) goto LAB_00143b67;
    uVar67 = uVar1 * (long)psVar86;
    lVar112 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar86),8);
    uVar119 = (ulong)(-uVar67 - 1 < uVar116);
    lVar83 = (0x7fffffffffffffff - lVar112) - lVar121;
    lVar118 = (-0x8000000000000000 - lVar112) - (ulong)(uVar67 != 0);
    lVar85 = lVar121 - lVar118;
    psVar68 = (secp256k1_gej *)(lVar85 - (ulong)(uVar116 < -uVar67));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar112,lVar121) != SBORROW8(lVar83,uVar119)) ==
              (long)(lVar83 - uVar119) < 0;
    if (lVar112 < 0) {
      bVar123 = (SBORROW8(lVar121,lVar118) != SBORROW8(lVar85,(ulong)(uVar116 < -uVar67))) ==
                (long)psVar68 < 0;
    }
    uVar90 = (uint)bVar123;
    if (bVar123 != false) {
      bVar123 = CARRY8(uVar120,(ulong)psVar87);
      uVar120 = (long)(psVar87->x).n + uVar120;
      psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)bVar123 + lVar84);
      bVar123 = CARRY8(uVar116,uVar67);
      uVar116 = uVar116 + uVar67;
      lVar121 = lVar121 + lVar112 + (ulong)bVar123;
      goto LAB_00143804;
    }
  }
  psStack_420 = (secp256k1_gej *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  a_02 = &sStack_480;
  psStack_430 = psVar87;
  psStack_428 = a_01;
  psStack_420 = psVar68;
  secp256k1_modinv64_mul_62(&sStack_458,(secp256k1_modinv64_signed62 *)psVar96,uVar90,1);
  psVar91 = a;
  secp256k1_modinv64_mul_62(&sStack_480,a,5,(int64_t)psVar86);
  lVar121 = 0;
  while ((ulong)sStack_458.v[lVar121] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_480.v[lVar121]) goto LAB_00143c01;
    lVar121 = lVar121 + 1;
    if (lVar121 == 4) {
      uVar90 = 4;
      while( true ) {
        if (sStack_458.v[uVar90] < sStack_480.v[uVar90]) {
          return;
        }
        if (sStack_480.v[uVar90] < sStack_458.v[uVar90]) break;
        bVar123 = uVar90 == 0;
        uVar90 = uVar90 - 1;
        if (bVar123) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00143c01:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar65 = (int)a_02;
  if (iVar65 < 1) {
LAB_00143ec0:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00143ec5:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00143eca:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00143ecf:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_00143ed4:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00143ed9:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar86->x).n[0];
    uVar2 = (psVar86->x).n[1];
    lVar121 = psVar91->v[0];
    lVar83 = *extraout_RDX_00;
    uVar116 = lVar121 * uVar1;
    lVar85 = SUB168(SEXT816(lVar121) * SEXT816((long)uVar1),8);
    uVar119 = lVar83 * uVar2;
    lVar112 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar2),8);
    lVar84 = (0x7fffffffffffffff - lVar112) - lVar85;
    if (-1 < lVar112 &&
        (SBORROW8(0x7fffffffffffffff - lVar112,lVar85) !=
        SBORROW8(lVar84,(ulong)(~uVar119 < uVar116))) !=
        (long)(lVar84 - (ulong)(~uVar119 < uVar116)) < 0) goto LAB_00143ec5;
    uVar3 = (psVar86->x).n[2];
    lVar85 = lVar112 + lVar85 + (ulong)CARRY8(uVar119,uVar116);
    uVar4 = (psVar86->x).n[3];
    uVar89 = lVar121 * uVar3;
    lVar84 = SUB168(SEXT816(lVar121) * SEXT816((long)uVar3),8);
    uVar120 = lVar83 * uVar4;
    lVar83 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar4),8);
    uVar67 = (ulong)(-uVar120 - 1 < uVar89);
    lVar121 = (0x7fffffffffffffff - lVar83) - lVar84;
    if (-1 < lVar83 &&
        (SBORROW8(0x7fffffffffffffff - lVar83,lVar84) != SBORROW8(lVar121,uVar67)) !=
        (long)(lVar121 - uVar67) < 0) goto LAB_00143eca;
    lVar121 = lVar83 + lVar84 + (ulong)CARRY8(uVar120,uVar89);
    if ((uVar119 + uVar116 & 0x3fffffffffffffff) != 0) goto LAB_00143ecf;
    if ((uVar120 + uVar89 & 0x3fffffffffffffff) != 0) goto LAB_00143ed4;
    uVar67 = uVar120 + uVar89 >> 0x3e | lVar121 * 4;
    uVar116 = uVar119 + uVar116 >> 0x3e | lVar85 * 4;
    lVar121 = lVar121 >> 0x3e;
    lVar85 = lVar85 >> 0x3e;
    if (iVar65 != 1) {
      psVar71 = (secp256k1_modinv64_signed62 *)((ulong)a_02 & 0xffffffff);
      a_02 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar83 = psVar91->v[(long)a_02];
        uVar89 = lVar83 * uVar1 + uVar116;
        lVar88 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar1),8) + lVar85 +
                 (ulong)CARRY8(lVar83 * uVar1,uVar116);
        lVar84 = extraout_RDX_00[(long)a_02];
        uVar119 = lVar84 * uVar2;
        lVar118 = SUB168(SEXT816(lVar84) * SEXT816((long)uVar2),8);
        uVar116 = (ulong)(-uVar119 - 1 < uVar89);
        lVar85 = (0x7fffffffffffffff - lVar118) - lVar88;
        psVar95 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar115 = (-0x8000000000000000 - lVar118) - (ulong)(uVar119 != 0);
        lVar112 = lVar88 - lVar115;
        bVar123 = (SBORROW8(0x7fffffffffffffff - lVar118,lVar88) != SBORROW8(lVar85,uVar116)) ==
                  (long)(lVar85 - uVar116) < 0;
        if (lVar118 < 0) {
          bVar123 = (SBORROW8(lVar88,lVar115) != SBORROW8(lVar112,(ulong)(uVar89 < -uVar119))) ==
                    (long)(lVar112 - (ulong)(uVar89 < -uVar119)) < 0;
        }
        if (!bVar123) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00143ebb:
          psVar91 = psVar95;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_00143ec0;
        }
        uVar109 = lVar83 * uVar3 + uVar67;
        lVar112 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar3),8) + lVar121 +
                  (ulong)CARRY8(lVar83 * uVar3,uVar67);
        uVar120 = lVar84 * uVar4;
        lVar84 = SUB168(SEXT816(lVar84) * SEXT816((long)uVar4),8);
        uVar116 = (ulong)(-uVar120 - 1 < uVar109);
        lVar121 = (0x7fffffffffffffff - lVar84) - lVar112;
        lVar85 = (-0x8000000000000000 - lVar84) - (ulong)(uVar120 != 0);
        lVar83 = lVar112 - lVar85;
        bVar123 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar112) != SBORROW8(lVar121,uVar116)) ==
                  (long)(lVar121 - uVar116) < 0;
        if (lVar84 < 0) {
          bVar123 = (SBORROW8(lVar112,lVar85) != SBORROW8(lVar83,(ulong)(uVar109 < -uVar120))) ==
                    (long)(lVar83 - (ulong)(uVar109 < -uVar120)) < 0;
        }
        if (!bVar123) goto LAB_00143ebb;
        lVar85 = lVar118 + lVar88 + (ulong)CARRY8(uVar119,uVar89);
        lVar121 = lVar84 + lVar112 + (ulong)CARRY8(uVar120,uVar109);
        uVar116 = lVar85 * 4 | uVar119 + uVar89 >> 0x3e;
        psVar91->v[(long)((long)a_02[-1].v + 0x27)] = uVar119 + uVar89 & 0x3fffffffffffffff;
        uVar67 = lVar121 * 4 | uVar120 + uVar109 >> 0x3e;
        extraout_RDX_00[(long)((long)a_02[-1].v + 0x27)] = uVar120 + uVar109 & 0x3fffffffffffffff;
        a_02 = (secp256k1_modinv64_signed62 *)((long)a_02->v + 1);
        lVar121 = lVar121 >> 0x3e;
        lVar85 = lVar85 >> 0x3e;
      } while (psVar71 != a_02);
    }
    if (lVar85 + -1 + (ulong)(0x7fffffffffffffff < uVar116) != -1) goto LAB_00143ed9;
    psVar91->v[(long)iVar65 + -1] = uVar116;
    if (lVar121 + -1 + (ulong)(0x7fffffffffffffff < uVar67) == -1) {
      extraout_RDX_00[(long)iVar65 + -1] = uVar67;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar121 = a_02->v[0];
  lVar83 = a_02->v[1];
  lVar84 = a_02->v[2];
  lVar85 = a_02->v[3];
  lVar112 = a_02->v[4];
  lVar118 = 0;
  do {
    if (a_02->v[lVar118] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014410f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00144114;
    }
    if (0x3fffffffffffffff < a_02->v[lVar118]) goto LAB_0014410f;
    lVar118 = lVar118 + 1;
  } while (lVar118 != 5);
  iVar65 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,-2);
  if (iVar65 < 1) {
LAB_00144114:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00144119:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014411e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar65 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
    if (-1 < iVar65) goto LAB_00144119;
    uVar116 = lVar112 >> 0x3f;
    uVar89 = (long)psVar91 >> 0x3f;
    uVar119 = ((uVar116 & b->v[0]) + lVar121 ^ uVar89) - uVar89;
    uVar120 = ((long)uVar119 >> 0x3e) + (((uVar116 & b->v[1]) + lVar83 ^ uVar89) - uVar89);
    uVar109 = ((long)uVar120 >> 0x3e) + ((lVar84 + (uVar116 & b->v[2]) ^ uVar89) - uVar89);
    uVar67 = ((long)uVar109 >> 0x3e) + (((uVar116 & b->v[3]) + lVar85 ^ uVar89) - uVar89);
    lVar121 = ((long)uVar67 >> 0x3e) + (((uVar116 & b->v[4]) + lVar112 ^ uVar89) - uVar89);
    uVar89 = lVar121 >> 0x3f;
    uVar116 = (b->v[0] & uVar89) + (uVar119 & 0x3fffffffffffffff);
    uVar120 = ((long)uVar116 >> 0x3e) + (b->v[1] & uVar89) + (uVar120 & 0x3fffffffffffffff);
    uVar119 = ((long)uVar120 >> 0x3e) + (b->v[2] & uVar89) + (uVar109 & 0x3fffffffffffffff);
    uVar67 = ((long)uVar119 >> 0x3e) + (b->v[3] & uVar89) + (uVar67 & 0x3fffffffffffffff);
    uVar89 = (b->v[4] & uVar89) + lVar121 + ((long)uVar67 >> 0x3e);
    a_02->v[0] = uVar116 & 0x3fffffffffffffff;
    a_02->v[1] = uVar120 & 0x3fffffffffffffff;
    a_02->v[2] = uVar119 & 0x3fffffffffffffff;
    a_02->v[3] = uVar67 & 0x3fffffffffffffff;
    a_02->v[4] = uVar89;
    if (0x3fffffffffffffff < uVar89) goto LAB_0014411e;
    iVar65 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,0);
    if (-1 < iVar65) {
      iVar65 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
      if (iVar65 < 0) {
        return;
      }
      goto LAB_00144128;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00144128:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_check_overflow(const secp256k1_scalar *a) {
    int yes = 0;
    int no = 0;
    no |= (a->d[3] < SECP256K1_N_3); /* No need for a > check. */
    no |= (a->d[2] < SECP256K1_N_2);
    yes |= (a->d[2] > SECP256K1_N_2) & ~no;
    no |= (a->d[1] < SECP256K1_N_1);
    yes |= (a->d[1] > SECP256K1_N_1) & ~no;
    yes |= (a->d[0] >= SECP256K1_N_0) & ~no;
    return yes;
}